

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qheaderview.cpp
# Opt level: O3

void __thiscall QHeaderViewPrivate::setHeaderMode(QHeaderViewPrivate *this,HeaderMode mode)

{
  QHeaderView *this_00;
  qsizetype qVar1;
  
  if (this->headerMode != mode) {
    this_00 = *(QHeaderView **)
               &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                super_QFramePrivate.super_QWidgetPrivate.field_0x8;
    this->headerMode = mode;
    if (this_00 != (QHeaderView *)0x0) {
      QObject::blockSignals(SUB81(this_00,0));
    }
    if (mode == InitialNoSectionMemoryUsage) {
      qVar1 = (this->sectionItems).d.size;
      this->countInNoSectionItemsMode = 0;
      QList<QHeaderViewPrivate::SectionItem>::clear(&this->sectionItems);
      QList<int>::clear(&this->visualIndices);
      QList<int>::clear(&this->logicalIndices);
      QHash<int,_int>::clear(&this->hiddenSectionSize);
      QHash<int,_int>::clear(&this->cascadingSectionSize);
      updateCountInNoSectionItemsMode(this,(int)qVar1);
    }
    else {
      this->length = 0;
      this->countInNoSectionItemsMode = 0;
      QHeaderView::initializeSections(this_00);
    }
    if (this_00 != (QHeaderView *)0x0) {
      QObject::blockSignals(SUB81(this_00,0));
      return;
    }
  }
  return;
}

Assistant:

void QHeaderViewPrivate::setHeaderMode(HeaderMode mode)
{
    Q_Q(QHeaderView);

    if (mode == headerMode)
        return;

    const bool avoidSectionMemoryUsage = (mode == HeaderMode::InitialNoSectionMemoryUsage);
    headerMode = mode;

    QSignalBlocker b(q); // Avoid emit of section count changed.
    if (avoidSectionMemoryUsage) {
        const int sectionCount = sectionItems.count();
        countInNoSectionItemsMode = 0;
        sectionItems.clear();
        visualIndices.clear();
        logicalIndices.clear();
        hiddenSectionSize.clear();
        cascadingSectionSize.clear();
        updateCountInNoSectionItemsMode(sectionCount);
    }
    else {
        length = 0;
        countInNoSectionItemsMode = 0;
        q->initializeSections();
    }
}